

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O3

bool utf8::CharsAreEqual(LPCOLESTR pch,LPCUTF8 bch,LPCUTF8 end,DecodeOptions options)

{
  byte *pbVar1;
  byte bVar2;
  char16 cVar3;
  byte *pbVar4;
  char16 cVar5;
  DecodeOptions local_3c;
  byte *pbStack_38;
  DecodeOptions localOptions;
  LPCUTF8 bch_local;
  
  local_3c = options;
  pbStack_38 = bch;
  do {
    pbVar4 = pbStack_38;
    if (end <= pbStack_38) break;
    cVar3 = *pch;
    pbVar1 = pbStack_38 + 1;
    bVar2 = *pbStack_38;
    cVar5 = (char16)bVar2;
    pbStack_38 = pbVar1;
    if ((char)bVar2 < '\0') {
      cVar5 = DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,end,&local_3c,(bool *)0x0);
    }
    pch = pch + 1;
  } while (cVar3 == cVar5);
  return end <= pbVar4;
}

Assistant:

bool CharsAreEqual(LPCOLESTR pch, LPCUTF8 bch, LPCUTF8 end, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        while (bch < end)
        {
            if (*pch++ != utf8::Decode(bch, end, localOptions))
            {
                return false;
            }
        }
        return true;
    }